

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall pbrt::UberMaterial::readFrom(UberMaterial *this,BinaryReader *binary)

{
  size_t sVar1;
  pointer puVar2;
  undefined8 uVar3;
  size_t sVar4;
  runtime_error *this_00;
  
  Material::readFrom(&this->super_Material,binary);
  sVar1 = binary->currentEntityOffset;
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0xc) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    (this->kd).z = *(float *)(puVar2 + sVar1 + 8);
    uVar3 = *(undefined8 *)(puVar2 + sVar1);
    (this->kd).x = (float)(int)uVar3;
    (this->kd).y = (float)(int)((ulong)uVar3 >> 0x20);
    binary->currentEntityOffset = binary->currentEntityOffset + 0xc;
    BinaryReader::read<pbrt::Texture>(binary,&this->map_kd);
    sVar1 = binary->currentEntityOffset;
    puVar2 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0xc) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
    else {
      (this->ks).z = *(float *)(puVar2 + sVar1 + 8);
      uVar3 = *(undefined8 *)(puVar2 + sVar1);
      (this->ks).x = (float)(int)uVar3;
      (this->ks).y = (float)(int)((ulong)uVar3 >> 0x20);
      binary->currentEntityOffset = binary->currentEntityOffset + 0xc;
      BinaryReader::read<pbrt::Texture>(binary,&this->map_ks);
      sVar1 = binary->currentEntityOffset;
      puVar2 = (binary->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(binary->currentEntityData).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0xc) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"invalid read attempt by entity - not enough data in data block!");
      }
      else {
        (this->kr).z = *(float *)(puVar2 + sVar1 + 8);
        uVar3 = *(undefined8 *)(puVar2 + sVar1);
        (this->kr).x = (float)(int)uVar3;
        (this->kr).y = (float)(int)((ulong)uVar3 >> 0x20);
        binary->currentEntityOffset = binary->currentEntityOffset + 0xc;
        BinaryReader::read<pbrt::Texture>(binary,&this->map_kr);
        sVar1 = binary->currentEntityOffset;
        puVar2 = (binary->currentEntityData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(binary->currentEntityData).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0xc) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"invalid read attempt by entity - not enough data in data block!");
        }
        else {
          (this->kt).z = *(float *)(puVar2 + sVar1 + 8);
          uVar3 = *(undefined8 *)(puVar2 + sVar1);
          (this->kt).x = (float)(int)uVar3;
          (this->kt).y = (float)(int)((ulong)uVar3 >> 0x20);
          binary->currentEntityOffset = binary->currentEntityOffset + 0xc;
          BinaryReader::read<pbrt::Texture>(binary,&this->map_kt);
          sVar1 = binary->currentEntityOffset;
          puVar2 = (binary->currentEntityData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(binary->currentEntityData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0xc)
          {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,"invalid read attempt by entity - not enough data in data block!");
          }
          else {
            (this->opacity).z = *(float *)(puVar2 + sVar1 + 8);
            uVar3 = *(undefined8 *)(puVar2 + sVar1);
            (this->opacity).x = (float)(int)uVar3;
            (this->opacity).y = (float)(int)((ulong)uVar3 >> 0x20);
            binary->currentEntityOffset = binary->currentEntityOffset + 0xc;
            BinaryReader::read<pbrt::Texture>(binary,&this->map_opacity);
            puVar2 = (binary->currentEntityData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(binary->currentEntityData).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <
                binary->currentEntityOffset + 4) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"invalid read attempt by entity - not enough data in data block!");
            }
            else {
              this->alpha = *(float *)(puVar2 + binary->currentEntityOffset);
              binary->currentEntityOffset = binary->currentEntityOffset + 4;
              BinaryReader::read<pbrt::Texture>(binary,&this->map_alpha);
              puVar2 = (binary->currentEntityData).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(binary->currentEntityData).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <
                  binary->currentEntityOffset + 4) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (this_00,"invalid read attempt by entity - not enough data in data block!"
                          );
              }
              else {
                this->shadowAlpha = *(float *)(puVar2 + binary->currentEntityOffset);
                binary->currentEntityOffset = binary->currentEntityOffset + 4;
                BinaryReader::read<pbrt::Texture>(binary,&this->map_shadowAlpha);
                puVar2 = (binary->currentEntityData).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(binary->currentEntityData).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <
                    binary->currentEntityOffset + 4) {
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (this_00,
                             "invalid read attempt by entity - not enough data in data block!");
                }
                else {
                  this->index = *(float *)(puVar2 + binary->currentEntityOffset);
                  sVar4 = binary->currentEntityOffset;
                  sVar1 = sVar4 + 4;
                  binary->currentEntityOffset = sVar1;
                  puVar2 = (binary->currentEntityData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  if (sVar4 + 8 <=
                      (ulong)((long)(binary->currentEntityData).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
                    this->roughness = *(float *)(puVar2 + sVar1);
                    binary->currentEntityOffset = binary->currentEntityOffset + 4;
                    BinaryReader::read<pbrt::Texture>(binary,&this->map_roughness);
                    BinaryReader::read<pbrt::Texture>(binary,&this->map_bump);
                    return;
                  }
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (this_00,
                             "invalid read attempt by entity - not enough data in data block!");
                }
              }
            }
          }
        }
      }
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void UberMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(kd);
    binary.read(map_kd);
    binary.read(ks);
    binary.read(map_ks);
    binary.read(kr);
    binary.read(map_kr);
    binary.read(kt);
    binary.read(map_kt);
    binary.read(opacity);
    binary.read(map_opacity);
    binary.read(alpha);
    binary.read(map_alpha);
    binary.read(shadowAlpha);
    binary.read(map_shadowAlpha);
    binary.read(index);
    binary.read(roughness);
    binary.read(map_roughness);
    binary.read(map_bump);
  }